

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O0

float __thiscall
sptk::reaper::FFT::get_band_rms(FFT *this,float *x,float *y,int first_bin,int last_bin)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int in_R8D;
  double dVar1;
  int i;
  double sum;
  undefined4 local_2c;
  undefined8 local_28;
  
  local_28 = 0.0;
  for (local_2c = in_ECX; local_2c <= in_R8D; local_2c = local_2c + 1) {
    local_28 = (double)(*(float *)(in_RSI + (long)local_2c * 4) *
                        *(float *)(in_RSI + (long)local_2c * 4) +
                       *(float *)(in_RDX + (long)local_2c * 4) *
                       *(float *)(in_RDX + (long)local_2c * 4)) + local_28;
  }
  dVar1 = sqrt(local_28 / (double)((in_R8D - in_ECX) + 1));
  return (float)dVar1;
}

Assistant:

float FFT::get_band_rms(float *x, float*y, int first_bin, int last_bin) {
  double sum = 0.0;
  for (int i = first_bin; i <= last_bin; ++i) {
    sum += (x[i] * x[i]) + (y[i] * y[i]);
  }
  return sqrt(sum / (last_bin - first_bin + 1));
}